

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

void __thiscall node::~node(node *this)

{
  tensor *ptVar1;
  pointer pdVar2;
  pointer pptVar3;
  
  this->_vptr_node = (_func_int **)&PTR_forward_0010a988;
  ptVar1 = this->ret;
  ptVar1->hook = (node *)0x0;
  if (ptVar1 != (tensor *)0x0) {
    tensor::tensor_cnt = tensor::tensor_cnt + -1;
    operator_delete(ptVar1,0x20);
  }
  node_cnt = node_cnt + -1;
  pdVar2 = (this->grad_fn).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2,(long)(this->grad_fn).super__Vector_base<double,_std::allocator<double>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar2);
  }
  pptVar3 = (this->input).super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar3 != (pointer)0x0) {
    operator_delete(pptVar3,(long)(this->input).
                                  super__Vector_base<tensor_*,_std::allocator<tensor_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage - (long)pptVar3);
    return;
  }
  return;
}

Assistant:

virtual ~node(){
//        ret->cnt_free--; //记录被释放几次
//        cout<<ret->cnt_free<<" ";
        ret->hook=NULL;

//        if(ret->cnt_free<=0) //因为最后输出不会作为其他输入，所以可能有负数的情况
        delete ret;
        node_cnt--;
    }